

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_function_call
          (irGenerator *this,string *retName,SymbolKind kind,string *funcName,
          vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params,bool begin)

{
  pointer pvVar1;
  uint32_t uVar2;
  VarId *pVVar3;
  CallInst *this_00;
  pointer __rhs;
  shared_ptr<mir::inst::VarId> destVarId;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  var;
  shared_ptr<mir::inst::Inst> callInst;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> paramValues;
  VarId local_b0;
  undefined1 local_a0 [16];
  _Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_> local_90;
  string local_78;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  paramValues.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paramValues.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  paramValues.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  callInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  callInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (kind != Ptr) {
    if (kind == VID) {
      pVVar3 = (VarId *)operator_new(0x10);
      uVar2 = this->_VoidVarId;
      (pVVar3->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      pVVar3->id = uVar2;
      std::__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mir::inst::VarId,void>
                ((__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2> *)&var,pVVar3);
      std::__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2> *)&var);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&var.
                         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> +
                 8));
      goto LAB_0016c43e;
    }
    if (kind != INT) goto LAB_0016c43e;
  }
  pVVar3 = (VarId *)operator_new(0x10);
  std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
  _Variant_storage<1ul,std::__cxx11::string&>
            ((_Variant_storage<false,int,std::__cxx11::string> *)&local_58,retName);
  uVar2 = LeftValueToLabelId(this,(LeftVal *)&local_58);
  (pVVar3->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  pVVar3->id = uVar2;
  std::__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::VarId,void>
            ((__shared_ptr<mir::inst::VarId,(__gnu_cxx::_Lock_policy)2> *)&var,pVVar3);
  std::__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2> *)&var);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&var.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_58);
LAB_0016c43e:
  pvVar1 = (params->
           super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = (params->
               super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __rhs != pvVar1; __rhs = __rhs + 1) {
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&var,(_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)__rhs);
    rightValueToValue((irGenerator *)local_a0,(RightVal *)this);
    std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
              (&paramValues,(value_type *)local_a0._0_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&var);
  }
  this_00 = (CallInst *)operator_new(0x50);
  local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_b0.id = (destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->id;
  std::__cxx11::string::string((string *)&local_78,(string *)funcName);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)&local_90,&paramValues);
  mir::inst::CallInst::CallInst
            (this_00,&local_b0,&local_78,
             (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)&local_90);
  std::__shared_ptr<mir::inst::CallInst,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::CallInst,void>
            ((__shared_ptr<mir::inst::CallInst,(__gnu_cxx::_Lock_policy)2> *)&var,this_00);
  std::__shared_ptr<mir::inst::Inst,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<mir::inst::Inst,(__gnu_cxx::_Lock_policy)2> *)&callInst,
             (__shared_ptr<mir::inst::CallInst,_(__gnu_cxx::_Lock_policy)2> *)&var);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&var.
                     super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                     super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8))
  ;
  std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base(&local_90);
  std::__cxx11::string::~string((string *)&local_78);
  insertInstruction(this,&callInst,begin);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&callInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base
            (&paramValues.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&destVarId.super___shared_ptr<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void irGenerator::ir_function_call(string retName, symbol::SymbolKind kind,
                                   string funcName,
                                   std::vector<RightVal> params, bool begin) {
  shared_ptr<VarId> destVarId;
  std::vector<Value> paramValues;
  shared_ptr<mir::inst::Inst> callInst;

  switch (kind) {
    case front::symbol::SymbolKind::Ptr:
    case front::symbol::SymbolKind::INT: {
      destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(retName)));
      break;
    }
    case front::symbol::SymbolKind::VID: {
      destVarId = shared_ptr<VarId>(new VarId(_VoidVarId));
      break;
    }
    default:
      break;
  }

  for (auto var : params) {
    paramValues.push_back(*rightValueToValue(var));
  }

  callInst = shared_ptr<mir::inst::CallInst>(
      new mir::inst::CallInst(*destVarId, funcName, paramValues));

  insertInstruction(callInst, begin);
}